

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O1

bool __thiscall TRM::Edge::intersect(Edge *this,Edge *other,vec2 *point)

{
  float fVar1;
  float fVar2;
  double dVar3;
  Vertex *pVVar4;
  Vertex *pVVar5;
  Vertex *pVVar6;
  Vertex *pVVar7;
  Vertex *pVVar8;
  Vertex *pVVar9;
  float fVar10;
  float fVar11;
  double dVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  double dVar17;
  double dVar18;
  
  pVVar4 = this->top;
  pVVar5 = other->top;
  if (pVVar4 != pVVar5) {
    pVVar6 = this->bottom;
    if (pVVar6 == pVVar5) {
      return false;
    }
    pVVar7 = other->bottom;
    if (pVVar6 == pVVar7) {
      return false;
    }
    if (pVVar4 == pVVar7) {
      return false;
    }
    fVar10 = *(float *)(pVVar6 + 0x48);
    fVar11 = *(float *)(pVVar4 + 0x48);
    fVar13 = fVar10;
    if (fVar11 <= fVar10) {
      fVar13 = fVar11;
    }
    fVar1 = *(float *)(pVVar5 + 0x48);
    fVar15 = *(float *)(pVVar7 + 0x48);
    fVar14 = fVar15;
    if (fVar15 <= fVar1) {
      fVar14 = fVar1;
    }
    if (fVar13 <= fVar14) {
      pVVar8 = pVVar4;
      if (fVar11 < fVar10) {
        pVVar8 = pVVar6;
      }
      pVVar9 = pVVar7;
      if (fVar1 <= fVar15) {
        pVVar9 = pVVar5;
      }
      if (*(float *)(pVVar9 + 0x48) < *(float *)(pVVar8 + 0x48) ||
          *(float *)(pVVar9 + 0x48) == *(float *)(pVVar8 + 0x48)) {
        fVar10 = *(float *)(pVVar6 + 0x4c);
        fVar13 = *(float *)(pVVar4 + 0x4c);
        fVar15 = fVar10;
        if (fVar13 <= fVar10) {
          fVar15 = fVar13;
        }
        fVar14 = *(float *)(pVVar5 + 0x4c);
        fVar2 = *(float *)(pVVar7 + 0x4c);
        fVar16 = fVar2;
        if (fVar2 <= fVar14) {
          fVar16 = fVar14;
        }
        if (fVar15 <= fVar16) {
          if (fVar10 <= fVar13) {
            pVVar6 = pVVar4;
          }
          if (fVar14 <= fVar2) {
            pVVar7 = pVVar5;
          }
          if (*(float *)(pVVar7 + 0x4c) < *(float *)(pVVar6 + 0x4c) ||
              *(float *)(pVVar7 + 0x4c) == *(float *)(pVVar6 + 0x4c)) {
            dVar3 = this->le_b;
            dVar12 = this->le_a * other->le_b - other->le_a * dVar3;
            if ((dVar12 != 0.0) || (NAN(dVar12))) {
              dVar17 = (double)fVar1 - (double)fVar11;
              dVar18 = other->le_b * ((double)fVar14 - (double)fVar13) + other->le_a * dVar17;
              dVar17 = ((double)fVar14 - (double)fVar13) * dVar3 + dVar17 * this->le_a;
              if (dVar12 <= 0.0) {
                if (0.0 < dVar18) {
                  return false;
                }
                if (dVar18 < dVar12) {
                  return false;
                }
                if (0.0 < dVar17) {
                  return false;
                }
                if (dVar17 < dVar12) {
                  return false;
                }
              }
              else {
                if (dVar18 < 0.0) {
                  return false;
                }
                if (dVar12 < dVar18) {
                  return false;
                }
                if (dVar17 < 0.0) {
                  return false;
                }
                if (dVar12 < dVar17) {
                  return false;
                }
              }
              fVar10 = roundf((float)((double)fVar11 - dVar3 * dVar18 * (1.0 / dVar12)));
              (point->field_0).x = fVar10;
              fVar11 = roundf((float)(dVar18 * this->le_a * (1.0 / dVar12) +
                                     (double)*(float *)(this->top + 0x4c)));
              (point->field_1).y = fVar11;
              if (ABS(fVar10) != INFINITY) {
                return ABS(fVar11) != INFINITY;
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Edge::intersect(Edge* other, glm::vec2* point) {
  if (top == other->top || bottom == other->bottom || top == other->bottom ||
      bottom == other->top) {
    return false;
  }

  // check if two aabb bounds is intersect
  if (std::min(top->point.x, bottom->point.x) >
          std::max(other->top->point.x, other->bottom->point.x) ||
      std::max(top->point.x, bottom->point.x) <
          std::min(other->top->point.x, other->bottom->point.x) ||
      std::min(top->point.y, bottom->point.y) >
          std::max(other->top->point.y, other->bottom->point.y) ||
      std::max(top->point.y, bottom->point.y) <
          std::min(other->top->point.y, other->bottom->point.y)) {
    return false;
  }

  double denom = le_a * other->le_b - le_b * other->le_a;

  if (denom == 0.0) {
    return false;
  }

  double dx = static_cast<double>(other->top->point.x) - top->point.x;
  double dy = static_cast<double>(other->top->point.y) - top->point.y;

  double s_number = dy * other->le_b + dx * other->le_a;
  double t_number = dy * le_b + dx * le_a;

  if (denom > 0.0 ? (s_number < 0.0 || s_number > denom || t_number < 0.0 ||
                     t_number > denom)
                  : (s_number > 0.0 || s_number < denom || t_number > 0.0 ||
                     t_number < denom)) {
    return false;
  }

  double scale = 1.0 / denom;

  point->x = glm::round(
      static_cast<float>(top->point.x - s_number * le_b * scale));
  point->y = glm::round(
      static_cast<float>(top->point.y + s_number * le_a * scale));

  if (glm::isinf(point->x) || glm::isinf(point->y)) {
    return false;
  }

  return true;
}